

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> __thiscall
deqp::egl::GLES2ThreadTest::EGLResourceManager::popImage(EGLResourceManager *this,int index)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> SVar2;
  
  lVar1 = CONCAT44(in_register_00000034,index);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)this,
             (SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)
             (*(long *)(lVar1 + 0x30) + (long)in_EDX * 0x10));
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>
  ::erase((vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>
           *)(lVar1 + 0x30),
          (SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)
          ((long)in_EDX * 0x10 + *(long *)(lVar1 + 0x30)));
  SVar2.m_state = extraout_RDX;
  SVar2.m_ptr = (EGLImage *)this;
  return SVar2;
}

Assistant:

SharedPtr<EGLImage> EGLResourceManager::popImage (int index)
{
	SharedPtr<EGLImage> image = m_images[index];
	m_images.erase(m_images.begin() + index);
	return image;
}